

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  ssize_t sVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 extraout_RAX;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  long *local_140 [2];
  long local_130 [2];
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  string local_100;
  string local_e0;
  int local_bc;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  long *local_58;
  undefined8 local_50;
  long local_48;
  undefined8 uStack_40;
  char local_31 [8];
  char status_ch;
  
  local_31[0] = 'L';
  if (reason != TEST_DID_NOT_DIE) {
    local_31[0] = (reason == TEST_THREW_EXCEPTION) * '\x02' + 'R';
  }
  do {
    sVar1 = write(this->write_fd_,local_31,1);
    if ((int)sVar1 != -1) {
      _exit(1);
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"CHECK failed: File ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_140);
  local_120 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_120 == plVar5) {
    local_110 = *plVar5;
    lStack_108 = plVar3[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *plVar5;
  }
  local_118 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_78 = (ulong *)*plVar3;
  puVar6 = (ulong *)(plVar3 + 2);
  if (local_78 == puVar6) {
    local_68 = *puVar6;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar6;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_bc = 0x207;
  StreamableToString<int>(&local_e0,&local_bc);
  uVar8 = 0xf;
  if (local_78 != &local_68) {
    uVar8 = local_68;
  }
  if (uVar8 < local_e0._M_string_length + local_70) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar9 = local_e0.field_2._M_allocated_capacity;
    }
    if (local_e0._M_string_length + local_70 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_78);
      goto LAB_0024ebe7;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_e0._M_dataplus._M_p);
LAB_0024ebe7:
  local_58 = (long *)*puVar4;
  plVar3 = puVar4 + 2;
  if (local_58 == plVar3) {
    local_48 = *plVar3;
    uStack_40 = puVar4[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
  }
  local_50 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_98 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_98 == plVar5) {
    local_88 = *plVar5;
    lStack_80 = plVar3[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar5;
  }
  local_90 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_b8 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_b8 == plVar5) {
    local_a8 = *plVar5;
    lStack_a0 = plVar3[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar5;
  }
  local_b0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_100._M_dataplus._M_p = (pointer)*plVar3;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_100._M_dataplus._M_p == psVar7) {
    local_100.field_2._M_allocated_capacity = *psVar7;
    local_100.field_2._8_8_ = plVar3[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar7;
  }
  local_100._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  DeathTestAbort(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch =
      reason == TEST_DID_NOT_DIE ? kDeathTestLived :
      reason == TEST_THREW_EXCEPTION ? kDeathTestThrew : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}